

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanFlowScalar(Scanner *this,bool IsDoubleQuoted)

{
  iterator pcVar1;
  char *pcVar2;
  bool bVar3;
  char *Position;
  iterator pcVar4;
  iterator pcVar5;
  undefined7 in_register_00000031;
  iterator Position_00;
  Child local_70;
  iterator local_68;
  long local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  uint local_34;
  
  pcVar1 = this->Current;
  local_34 = this->Column;
  if ((int)CONCAT71(in_register_00000031,IsDoubleQuoted) == 0) {
    skip(this,1);
LAB_00dc8c2c:
    Position_00 = this->Current;
    if (Position_00 + 1 < this->End) {
      if (*Position_00 == '\'') {
        if (Position_00[1] != '\'') goto LAB_00dc8ba9;
        skip(this,2);
        goto LAB_00dc8c2c;
      }
    }
    else if (*Position_00 == '\'') goto LAB_00dc8ba9;
    pcVar4 = skip_nb_char(this,Position_00);
    Position_00 = this->Current;
    if (pcVar4 == Position_00) {
      pcVar5 = skip_b_break(this,Position_00);
      Position_00 = pcVar4;
      if (pcVar5 == pcVar4) goto LAB_00dc8ba9;
      this->Current = pcVar5;
      this->Column = 0;
      this->Line = this->Line + 1;
    }
    else {
      if (pcVar4 == this->End) goto LAB_00dc8ba9;
      this->Current = pcVar4;
      this->Column = this->Column + 1;
    }
    goto LAB_00dc8c2c;
  }
  do {
    Position = this->Current;
    do {
      pcVar2 = Position;
      Position = pcVar2 + 1;
      this->Current = Position;
      Position_00 = this->End;
      if (Position == this->End) goto LAB_00dc8ba9;
    } while (*Position != '\"');
    Position_00 = Position;
    if (*pcVar2 != '\\') goto LAB_00dc8ba9;
    bVar3 = wasEscaped(pcVar1 + 1,Position);
  } while (bVar3);
  Position_00 = this->Current;
LAB_00dc8ba9:
  pcVar4 = this->End;
  if (Position_00 == pcVar4) {
    Twine::Twine((Twine *)&local_70,"Expected quote at end of scalar");
    setError(this,(Twine *)&local_70,this->Current);
  }
  else {
    skip(this,1);
    local_58 = &local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_70.decUI = 0x12;
    local_60 = (long)this->Current - (long)pcVar1;
    local_68 = pcVar1;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)&local_70);
    saveSimpleKeyCandidate
              (this,(iterator)
                    (this->TokenQueue).List.Sentinel.
                    super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                    .super_node_base_type.Prev,local_34,false);
    this->IsSimpleKeyAllowed = false;
    std::__cxx11::string::~string((string *)&local_58);
  }
  return Position_00 != pcVar4;
}

Assistant:

bool Scanner::scanFlowScalar(bool IsDoubleQuoted) {
  StringRef::iterator Start = Current;
  unsigned ColStart = Column;
  if (IsDoubleQuoted) {
    do {
      ++Current;
      while (Current != End && *Current != '"')
        ++Current;
      // Repeat until the previous character was not a '\' or was an escaped
      // backslash.
    } while (   Current != End
             && *(Current - 1) == '\\'
             && wasEscaped(Start + 1, Current));
  } else {
    skip(1);
    while (true) {
      // Skip a ' followed by another '.
      if (Current + 1 < End && *Current == '\'' && *(Current + 1) == '\'') {
        skip(2);
        continue;
      } else if (*Current == '\'')
        break;
      StringRef::iterator i = skip_nb_char(Current);
      if (i == Current) {
        i = skip_b_break(Current);
        if (i == Current)
          break;
        Current = i;
        Column = 0;
        ++Line;
      } else {
        if (i == End)
          break;
        Current = i;
        ++Column;
      }
    }
  }

  if (Current == End) {
    setError("Expected quote at end of scalar", Current);
    return false;
  }

  skip(1); // Skip ending quote.
  Token T;
  T.Kind = Token::TK_Scalar;
  T.Range = StringRef(Start, Current - Start);
  TokenQueue.push_back(T);

  saveSimpleKeyCandidate(--TokenQueue.end(), ColStart, false);

  IsSimpleKeyAllowed = false;

  return true;
}